

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString<long_double>(IsNaN<long_double> in)

{
  char *in_00;
  String *in_RDI;
  undefined8 in_stack_00000008;
  String local_b0;
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  in_00 = "";
  if (((undefined1  [32])in & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    in_00 = "! ";
  }
  String::String(&local_58,in_00);
  String::String(&local_70,"IsNaN( ");
  operator+(&local_40,&local_58,&local_70);
  toString(&local_98,(longdouble)CONCAT88(in.value._0_8_,in_stack_00000008));
  operator+(&local_28,&local_40,&local_98);
  String::String(&local_b0," )");
  operator+(in_RDI,&local_28,&local_b0);
  String::~String(&local_b0);
  String::~String(&local_28);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return in_RDI;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }